

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressBlock_btlazy2_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *iEnd;
  undefined8 *puVar1;
  BYTE *pBVar2;
  ZSTD_matchState_t *pZVar3;
  int iVar4;
  undefined8 uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  size_t sVar9;
  ulong uVar10;
  ulong uVar11;
  U32 UVar12;
  int *piVar13;
  BYTE *pBVar14;
  BYTE *pBVar15;
  int *piVar16;
  long lVar17;
  ulong uVar18;
  int *ip;
  int *piVar19;
  seqDef *psVar20;
  BYTE *pBVar21;
  int iVar22;
  int *iend;
  uint local_b4;
  size_t offbaseFound;
  uint local_9c;
  ulong local_98;
  ulong local_90;
  ZSTD_matchState_t *local_88;
  int *local_80;
  uint local_74;
  seqStore_t *local_70;
  BYTE *local_68;
  int *local_60;
  uint *local_58;
  BYTE *local_50;
  int *local_48;
  BYTE *local_40;
  BYTE *local_38;
  
  pBVar2 = (ms->window).base;
  local_74 = (ms->window).dictLimit;
  local_90 = (ulong)local_74;
  uVar6 = (ms->cParams).minMatch;
  uVar7 = 6;
  if (uVar6 < 6) {
    uVar7 = uVar6;
  }
  uVar6 = 4;
  if (4 < uVar7) {
    uVar6 = uVar7;
  }
  local_68 = pBVar2 + local_90;
  local_b4 = *rep;
  pZVar3 = ms->dictMatchState;
  local_60 = (int *)(pZVar3->window).nextSrc;
  local_50 = (pZVar3->window).base;
  local_38 = local_50 + (pZVar3->window).dictLimit;
  uVar7 = ((int)src - ((int)local_68 + (int)local_38)) + (int)local_60;
  ip = (int *)((long)src + (ulong)(uVar7 == 0));
  local_70 = seqStore;
  if (uVar7 < local_b4) {
    __assert_fail("offset_1 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7977,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  local_9c = rep[1];
  if (uVar7 < local_9c) {
    __assert_fail("offset_2 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7978,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  iEnd = (int *)((long)src + srcSize);
  local_48 = (int *)((long)src + (srcSize - 8));
  local_74 = ((int)local_50 - (int)local_60) + local_74;
  ms->lazySkipping = 0;
  local_40 = local_50 + -(ulong)local_74;
  local_80 = iEnd + -8;
  uVar7 = local_9c;
  local_88 = ms;
  local_58 = rep;
  do {
    while( true ) {
      local_9c = uVar7;
      if (local_48 <= ip) {
        *local_58 = local_b4;
        local_58[1] = local_9c;
        return (long)iEnd - (long)src;
      }
      iVar22 = (int)pBVar2;
      uVar7 = (((int)ip - iVar22) - local_b4) + 1;
      piVar16 = (int *)(pBVar2 + uVar7);
      if (uVar7 < (uint)local_90) {
        piVar16 = (int *)(local_50 + (uVar7 - local_74));
      }
      if ((uVar7 - (uint)local_90 < 0xfffffffd) && (*piVar16 == *(int *)((long)ip + 1))) {
        piVar13 = iEnd;
        if (uVar7 < (uint)local_90) {
          piVar13 = local_60;
        }
        sVar9 = ZSTD_count_2segments
                          ((BYTE *)((long)ip + 5),(BYTE *)(piVar16 + 1),(BYTE *)iEnd,(BYTE *)piVar13
                           ,local_68);
        uVar18 = sVar9 + 4;
      }
      else {
        uVar18 = 0;
      }
      offbaseFound = 999999999;
      if (uVar6 == 6) {
        uVar10 = ZSTD_BtFindBestMatch_dictMatchState_6(ms,(BYTE *)ip,(BYTE *)iEnd,&offbaseFound);
      }
      else if (uVar6 == 5) {
        uVar10 = ZSTD_BtFindBestMatch_dictMatchState_5(ms,(BYTE *)ip,(BYTE *)iEnd,&offbaseFound);
      }
      else {
        uVar10 = ZSTD_BtFindBestMatch_dictMatchState_4(ms,(BYTE *)ip,(BYTE *)iEnd,&offbaseFound);
      }
      uVar11 = uVar18;
      if (uVar18 < uVar10) {
        uVar11 = uVar10;
      }
      if (3 < uVar11) break;
      uVar18 = (long)ip - (long)src;
      ip = (int *)((long)ip + (uVar18 >> 8) + 1);
      local_88->lazySkipping = (uint)(0x7ff < uVar18);
      ms = local_88;
      uVar7 = local_9c;
    }
    sVar9 = 1;
    piVar16 = (int *)((long)ip + 1);
    if (uVar18 < uVar10) {
      sVar9 = offbaseFound;
      piVar16 = ip;
    }
LAB_00153278:
    do {
      iend = piVar16;
      uVar10 = uVar11;
      piVar19 = ip;
      uVar18 = sVar9;
      piVar13 = local_80;
      if (local_48 <= piVar19) break;
      ip = (int *)((long)piVar19 + 1);
      uVar7 = ((int)ip - iVar22) - local_b4;
      piVar16 = (int *)(pBVar2 + uVar7);
      if (uVar7 < (uint)local_90) {
        piVar16 = (int *)(local_50 + (uVar7 - local_74));
      }
      local_98 = uVar18;
      if ((uVar7 - (uint)local_90 < 0xfffffffd) && (*piVar16 == *ip)) {
        piVar13 = iEnd;
        if (uVar7 < (uint)local_90) {
          piVar13 = local_60;
        }
        sVar9 = ZSTD_count_2segments
                          ((BYTE *)((long)piVar19 + 5),(BYTE *)(piVar16 + 1),(BYTE *)iEnd,
                           (BYTE *)piVar13,local_68);
        if (sVar9 < 0xfffffffffffffffc) {
          uVar7 = 0x1f;
          if ((uint)local_98 != 0) {
            for (; (uint)local_98 >> uVar7 == 0; uVar7 = uVar7 - 1) {
            }
          }
          if ((int)((uVar7 ^ 0x1f) + (int)uVar10 * 3 + -0x1e) < (int)(sVar9 + 4) * 3) {
            local_98 = 1;
            uVar10 = sVar9 + 4;
            iend = ip;
          }
        }
      }
      offbaseFound = 999999999;
      if (uVar6 == 6) {
        uVar11 = ZSTD_BtFindBestMatch_dictMatchState_6
                           (local_88,(BYTE *)ip,(BYTE *)iEnd,&offbaseFound);
      }
      else if (uVar6 == 5) {
        uVar11 = ZSTD_BtFindBestMatch_dictMatchState_5
                           (local_88,(BYTE *)ip,(BYTE *)iEnd,&offbaseFound);
      }
      else {
        uVar11 = ZSTD_BtFindBestMatch_dictMatchState_4
                           (local_88,(BYTE *)ip,(BYTE *)iEnd,&offbaseFound);
      }
      if (3 < uVar11) {
        uVar7 = 0x1f;
        if ((uint)local_98 != 0) {
          for (; (uint)local_98 >> uVar7 == 0; uVar7 = uVar7 - 1) {
          }
        }
        iVar4 = 0x1f;
        if ((uint)offbaseFound != 0) {
          for (; (uint)offbaseFound >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        sVar9 = offbaseFound;
        piVar16 = ip;
        if ((int)((uVar7 ^ 0x1f) + (int)uVar10 * 4 + -0x1b) < (int)uVar11 * 4 - iVar4)
        goto LAB_00153278;
      }
      uVar18 = local_98;
      piVar13 = local_80;
      if (local_48 <= ip) break;
      ip = (int *)((long)piVar19 + 2);
      uVar7 = ((int)ip - iVar22) - local_b4;
      piVar16 = (int *)(pBVar2 + uVar7);
      if (uVar7 < (uint)local_90) {
        piVar16 = (int *)(local_50 + (uVar7 - local_74));
      }
      if ((uVar7 - (uint)local_90 < 0xfffffffd) && (*piVar16 == *ip)) {
        piVar13 = iEnd;
        if (uVar7 < (uint)local_90) {
          piVar13 = local_60;
        }
        sVar9 = ZSTD_count_2segments
                          ((BYTE *)((long)piVar19 + 6),(BYTE *)(piVar16 + 1),(BYTE *)iEnd,
                           (BYTE *)piVar13,local_68);
        if (sVar9 < 0xfffffffffffffffc) {
          uVar7 = 0x1f;
          if ((uint)local_98 != 0) {
            for (; (uint)local_98 >> uVar7 == 0; uVar7 = uVar7 - 1) {
            }
          }
          if ((int)((uVar7 ^ 0x1f) + (int)uVar10 * 4 + -0x1e) < (int)(sVar9 + 4) * 4) {
            local_98 = 1;
            uVar10 = sVar9 + 4;
            iend = ip;
          }
        }
      }
      piVar13 = local_80;
      offbaseFound = 999999999;
      if (uVar6 == 6) {
        uVar11 = ZSTD_BtFindBestMatch_dictMatchState_6
                           (local_88,(BYTE *)ip,(BYTE *)iEnd,&offbaseFound);
      }
      else if (uVar6 == 5) {
        uVar11 = ZSTD_BtFindBestMatch_dictMatchState_5
                           (local_88,(BYTE *)ip,(BYTE *)iEnd,&offbaseFound);
      }
      else {
        uVar11 = ZSTD_BtFindBestMatch_dictMatchState_4
                           (local_88,(BYTE *)ip,(BYTE *)iEnd,&offbaseFound);
      }
      uVar18 = local_98;
      if (uVar11 < 4) break;
      uVar7 = 0x1f;
      if ((uint)local_98 != 0) {
        for (; (uint)local_98 >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      iVar4 = 0x1f;
      if ((uint)offbaseFound != 0) {
        for (; (uint)offbaseFound >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar9 = offbaseFound;
      piVar16 = ip;
    } while ((int)((uVar7 ^ 0x1f) + (int)uVar10 * 4 + -0x18) < (int)uVar11 * 4 - iVar4);
    UVar12 = (U32)uVar18;
    if (3 < uVar18) {
      pBVar14 = (BYTE *)((long)iend + (-0xfffffffd - (long)(pBVar2 + uVar18)));
      pBVar15 = pBVar2;
      pBVar21 = local_68;
      if ((uint)pBVar14 < (uint)local_90) {
        pBVar15 = local_40;
        pBVar21 = local_38;
      }
      pBVar15 = pBVar15 + ((ulong)pBVar14 & 0xffffffff);
      for (; ((src < iend && (pBVar21 < pBVar15)) && (*(BYTE *)((long)iend + -1) == pBVar15[-1]));
          iend = (int *)((long)iend + -1)) {
        pBVar15 = pBVar15 + -1;
        uVar10 = uVar10 + 1;
      }
      local_9c = local_b4;
      local_b4 = UVar12 - 3;
    }
    if (local_70->maxNbSeq <=
        (ulong)((long)local_70->sequences - (long)local_70->sequencesStart >> 3)) {
LAB_001538d2:
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468b,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    local_98 = uVar18;
    if (0x20000 < local_70->maxNbLit) {
LAB_001538b3:
      __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468d,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    uVar18 = (long)iend - (long)src;
    pBVar21 = local_70->lit;
    if (local_70->litStart + local_70->maxNbLit < pBVar21 + uVar18) {
LAB_00153875:
      __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468e,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (iEnd < iend) {
LAB_00153894:
      __assert_fail("literals + litLength <= litLimit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468f,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (piVar13 < iend) {
      ZSTD_safecopyLiterals(pBVar21,(BYTE *)src,(BYTE *)iend,(BYTE *)piVar13);
LAB_001535c8:
      local_70->lit = local_70->lit + uVar18;
      UVar12 = (U32)local_98;
      if (0xffff < uVar18) {
        if (local_70->longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        local_70->longLengthType = ZSTD_llt_literalLength;
        local_70->longLengthPos =
             (U32)((ulong)((long)local_70->sequences - (long)local_70->sequencesStart) >> 3);
      }
    }
    else {
      uVar5 = *(undefined8 *)((long)src + 8);
      *(undefined8 *)pBVar21 = *src;
      *(undefined8 *)(pBVar21 + 8) = uVar5;
      pBVar21 = local_70->lit;
      if (0x10 < uVar18) {
        if ((BYTE *)0xffffffffffffffe0 < pBVar21 + 0x10 + (-0x10 - ((long)src + 0x10))) {
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x36a6,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        uVar5 = *(undefined8 *)((long)src + 0x18);
        *(undefined8 *)(pBVar21 + 0x10) = *(undefined8 *)((long)src + 0x10);
        *(undefined8 *)(pBVar21 + 0x18) = uVar5;
        if (0x20 < (long)uVar18) {
          lVar17 = 0;
          do {
            puVar1 = (undefined8 *)((long)src + lVar17 + 0x20);
            uVar5 = puVar1[1];
            pBVar15 = pBVar21 + lVar17 + 0x20;
            *(undefined8 *)pBVar15 = *puVar1;
            *(undefined8 *)(pBVar15 + 8) = uVar5;
            puVar1 = (undefined8 *)((long)src + lVar17 + 0x30);
            uVar5 = puVar1[1];
            *(undefined8 *)(pBVar15 + 0x10) = *puVar1;
            *(undefined8 *)(pBVar15 + 0x18) = uVar5;
            lVar17 = lVar17 + 0x20;
          } while (pBVar15 + 0x20 < pBVar21 + uVar18);
        }
        goto LAB_001535c8;
      }
      local_70->lit = pBVar21 + uVar18;
    }
    ms = local_88;
    psVar20 = local_70->sequences;
    psVar20->litLength = (U16)uVar18;
    psVar20->offBase = UVar12;
    if (uVar10 < 3) {
LAB_00153856:
      __assert_fail("matchLength >= MINMATCH",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x46aa,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0xffff < uVar10 - 3) {
      if (local_70->longLengthType != ZSTD_llt_none) {
LAB_001538f1:
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x46ad,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      local_70->longLengthType = ZSTD_llt_matchLength;
      local_70->longLengthPos = (U32)((ulong)((long)psVar20 - (long)local_70->sequencesStart) >> 3);
    }
    psVar20->mlBase = (U16)(uVar10 - 3);
    psVar20 = psVar20 + 1;
    local_70->sequences = psVar20;
    if (local_88->lazySkipping != 0) {
      local_88->lazySkipping = 0;
    }
    uVar8 = local_9c;
    for (ip = (int *)((long)iend + uVar10); uVar7 = uVar8, src = ip, ip <= local_48;
        ip = (int *)((long)ip + sVar9 + 4)) {
      uVar8 = ((int)ip - iVar22) - uVar7;
      pBVar21 = pBVar2;
      if (uVar8 < (uint)local_90) {
        pBVar21 = local_40;
      }
      if ((0xfffffffc < uVar8 - (uint)local_90) || (*(int *)(pBVar21 + uVar8) != *ip)) break;
      piVar16 = iEnd;
      if (uVar8 < (uint)local_90) {
        piVar16 = local_60;
      }
      sVar9 = ZSTD_count_2segments
                        ((BYTE *)(ip + 1),(BYTE *)((long)(pBVar21 + uVar8) + 4),(BYTE *)iEnd,
                         (BYTE *)piVar16,local_68);
      if (local_70->maxNbSeq <= (ulong)((long)psVar20 - (long)local_70->sequencesStart >> 3))
      goto LAB_001538d2;
      if (0x20000 < local_70->maxNbLit) goto LAB_001538b3;
      pBVar21 = local_70->lit;
      if (local_70->litStart + local_70->maxNbLit < pBVar21) goto LAB_00153875;
      if (iEnd < ip) goto LAB_00153894;
      if (local_80 < ip) {
        ZSTD_safecopyLiterals(pBVar21,(BYTE *)ip,(BYTE *)ip,(BYTE *)local_80);
      }
      else {
        uVar5 = *(undefined8 *)(ip + 2);
        *(undefined8 *)pBVar21 = *(undefined8 *)ip;
        *(undefined8 *)(pBVar21 + 8) = uVar5;
      }
      psVar20 = local_70->sequences;
      psVar20->litLength = 0;
      psVar20->offBase = 1;
      if (sVar9 + 4 < 3) goto LAB_00153856;
      if (0xffff < sVar9 + 1) {
        if (local_70->longLengthType != ZSTD_llt_none) goto LAB_001538f1;
        local_70->longLengthType = ZSTD_llt_matchLength;
        local_70->longLengthPos =
             (U32)((ulong)((long)psVar20 - (long)local_70->sequencesStart) >> 3);
      }
      psVar20->mlBase = (U16)(sVar9 + 1);
      psVar20 = psVar20 + 1;
      local_70->sequences = psVar20;
      uVar8 = local_b4;
      local_b4 = uVar7;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_btlazy2_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_binaryTree, 2, ZSTD_dictMatchState);
}